

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetCompileOptionsCommand::HandleDirectContent
          (cmTargetCompileOptionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  cmListFileBacktrace lfbt;
  undefined1 auStack_48 [16];
  string local_38;
  
  cmMakefile::GetBacktrace((cmMakefile *)auStack_48);
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[10])
            (&local_38,this,content);
  cmTarget::InsertCompileOption(tgt,&local_38,(cmListFileBacktrace *)auStack_48,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  return true;
}

Assistant:

bool cmTargetCompileOptionsCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  tgt->InsertCompileOption(this->Join(content), lfbt);
  return true; // Successfully handled.
}